

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::UpdatedBlockTip
          (PeerManagerImpl *this,CBlockIndex *pindexNew,CBlockIndex *pindexFork,
          bool fInitialDownload)

{
  uint uVar1;
  _Base_ptr p_Var2;
  pointer puVar3;
  _Base_ptr p_Var4;
  undefined7 in_register_00000009;
  __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> __tmp;
  pointer __x;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> vHashes;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock45;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock44;
  _Vector_base<uint256,_std::allocator<uint256>_> local_88;
  unique_lock<std::mutex> local_68;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = pindexNew->nTime;
  LOCK();
  (this->m_best_height).super___atomic_base<int>._M_i = pindexNew->nHeight;
  UNLOCK();
  LOCK();
  (this->m_best_block_time)._M_i.__r = (ulong)uVar1;
  UNLOCK();
  if ((int)CONCAT71(in_register_00000009,fInitialDownload) == 0) {
    local_88._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      if (pindexNew == pindexFork) break;
      CBlockIndex::GetBlockHash(&local_58,pindexNew);
      std::vector<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                ((vector<uint256,_std::allocator<uint256>_> *)&local_88,&local_58);
      pindexNew = pindexNew->pprev;
    } while ((long)local_88._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88._M_impl.super__Vector_impl_data._M_start != 0x100);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_58,&this->m_peer_mutex,
               "m_peer_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0x8df,false);
    for (p_Var4 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
      p_Var2 = p_Var4[1]._M_parent;
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_68,
                 (AnnotatedMixin<std::mutex> *)&p_Var2[2]._M_parent,"peer.m_block_inv_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                 ,0x8e2,false);
      puVar3 = local_88._M_impl.super__Vector_impl_data._M_start;
      __x = local_88._M_impl.super__Vector_impl_data._M_finish;
      while (__x != puVar3) {
        __x = __x + -1;
        std::vector<uint256,_std::allocator<uint256>_>::push_back
                  ((vector<uint256,_std::allocator<uint256>_> *)&p_Var2[4]._M_parent,__x);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_68);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_58);
    CConnman::WakeMessageHandler(this->m_connman);
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::UpdatedBlockTip(const CBlockIndex *pindexNew, const CBlockIndex *pindexFork, bool fInitialDownload)
{
    SetBestBlock(pindexNew->nHeight, std::chrono::seconds{pindexNew->GetBlockTime()});

    // Don't relay inventory during initial block download.
    if (fInitialDownload) return;

    // Find the hashes of all blocks that weren't previously in the best chain.
    std::vector<uint256> vHashes;
    const CBlockIndex *pindexToAnnounce = pindexNew;
    while (pindexToAnnounce != pindexFork) {
        vHashes.push_back(pindexToAnnounce->GetBlockHash());
        pindexToAnnounce = pindexToAnnounce->pprev;
        if (vHashes.size() == MAX_BLOCKS_TO_ANNOUNCE) {
            // Limit announcements in case of a huge reorganization.
            // Rely on the peer's synchronization mechanism in that case.
            break;
        }
    }

    {
        LOCK(m_peer_mutex);
        for (auto& it : m_peer_map) {
            Peer& peer = *it.second;
            LOCK(peer.m_block_inv_mutex);
            for (const uint256& hash : vHashes | std::views::reverse) {
                peer.m_blocks_for_headers_relay.push_back(hash);
            }
        }
    }

    m_connman.WakeMessageHandler();
}